

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O0

FastString __thiscall Strings::convert(Strings *this,ReadOnlyUnicodeString *string)

{
  uint uVar1;
  int iVar2;
  CharPointer pCVar3;
  uchar *extraout_RDX;
  FastString FVar4;
  byte local_30;
  byte bStack_2d;
  uint32 c;
  int local_20;
  int i;
  ReadOnlyUnicodeString *string_local;
  FastString *ret;
  
  Bstrlib::String::String((String *)this);
  for (local_20 = 0; iVar2 = ReadOnlyUnicodeString::getLength(string), local_20 < iVar2;
      local_20 = local_20 + 1) {
    pCVar3 = ReadOnlyUnicodeString::getData(string);
    uVar1 = pCVar3[local_20];
    local_30 = (byte)uVar1;
    if (uVar1 < 0x80) {
      Bstrlib::String::operator+=((String *)this,local_30);
    }
    else if (uVar1 < 0x800) {
      Bstrlib::String::operator+=((String *)this,(byte)(uVar1 >> 6) | 0xc0);
      Bstrlib::String::operator+=((String *)this,local_30 & 0x3f | 0x80);
    }
    else if (uVar1 < 0x10000) {
      Bstrlib::String::operator+=((String *)this,(byte)(uVar1 >> 0xc) | 0xe0);
      Bstrlib::String::operator+=((String *)this,(byte)(uVar1 >> 6) & 0x3f | 0x80);
      Bstrlib::String::operator+=((String *)this,local_30 & 0x3f | 0x80);
    }
    else if (uVar1 < 0x200000) {
      Bstrlib::String::operator+=((String *)this,(byte)(uVar1 >> 0x12) | 0xf0);
      Bstrlib::String::operator+=((String *)this,(byte)(uVar1 >> 0xc) & 0x3f | 0x80);
      Bstrlib::String::operator+=((String *)this,(byte)(uVar1 >> 6) & 0x3f | 0x80);
      Bstrlib::String::operator+=((String *)this,local_30 & 0x3f | 0x80);
    }
    else {
      bStack_2d = (byte)(uVar1 >> 0x18);
      if (uVar1 < 0x4000000) {
        Bstrlib::String::operator+=((String *)this,bStack_2d | 0xf8);
        Bstrlib::String::operator+=((String *)this,(byte)(uVar1 >> 0x12) & 0x3f | 0x80);
        Bstrlib::String::operator+=((String *)this,(byte)(uVar1 >> 0xc) & 0x3f | 0x80);
        Bstrlib::String::operator+=((String *)this,(byte)(uVar1 >> 6) & 0x3f | 0x80);
        Bstrlib::String::operator+=((String *)this,local_30 & 0x3f | 0x80);
      }
      else if (uVar1 < 0x80000000) {
        Bstrlib::String::operator+=((String *)this,bStack_2d >> 6 | 0xfc);
        Bstrlib::String::operator+=((String *)this,bStack_2d & 0x3f | 0x80);
        Bstrlib::String::operator+=((String *)this,(byte)(uVar1 >> 0x12) & 0x3f | 0x80);
        Bstrlib::String::operator+=((String *)this,(byte)(uVar1 >> 0xc) & 0x3f | 0x80);
        Bstrlib::String::operator+=((String *)this,(byte)(uVar1 >> 6) & 0x3f | 0x80);
        Bstrlib::String::operator+=((String *)this,local_30 & 0x3f | 0x80);
      }
    }
  }
  FVar4.super_tagbstring.data = extraout_RDX;
  FVar4.super_tagbstring._0_8_ = this;
  return (FastString)FVar4.super_tagbstring;
}

Assistant:

FastString convert(const ReadOnlyUnicodeString & string)
    {
        FastString ret;
        for (int i = 0; i < string.getLength(); i++)
        {
            const uint32 c = string.getData()[i];

            // From http://www1.tip.nl/~t876506/utf8tbl.html#algo
            if (c < 0x80)
            {   // Single byte char
                ret += (uint8)c;
            } // Multi byte char
            else if (c < 0x800)
            {   // 2 bytes encoding
                ret += (uint8)(0xc0 | (c >> 6));
                ret += (uint8)(0x80 | (c & 0x3f));
            }
            else if (c < 0x10000)
            {   // 3 bytes encoding
                ret += (uint8)(0xe0 | (c >> 12));
                ret += (uint8)(0x80 | ( (c>>6) & 0x3f));
                ret += (uint8)(0x80 | (c & 0x3f));
            }
            else if (c < 0x200000)
            {   // 4 bytes encoding
                ret += (uint8)(0xf0 | (c >> 18));
                ret += (uint8)(0x80 | ( (c>>12) & 0x3f));
                ret += (uint8)(0x80 | ( (c>>6) & 0x3f));
                ret += (uint8)(0x80 | (c & 0x3f));
            }
            else if (c < 0x4000000)
            {   // 5 bytes encoding
                ret += (uint8)(0xf8 | (c >> 24));
                ret += (uint8)(0x80 | ( (c>>18) & 0x3f));
                ret += (uint8)(0x80 | ( (c>>12) & 0x3f));
                ret += (uint8)(0x80 | ( (c>>6) & 0x3f));
                ret += (uint8)(0x80 | (c & 0x3f));
            }
            else if (c < 0x80000000)
            {   // 6 bytes encoding
                ret += (uint8)(0xfc | (c >> 30));
                ret += (uint8)(0x80 | ( (c>>24) & 0x3f));
                ret += (uint8)(0x80 | ( (c>>18) & 0x3f));
                ret += (uint8)(0x80 | ( (c>>12) & 0x3f));
                ret += (uint8)(0x80 | ( (c>>6) & 0x3f));
                ret += (uint8)(0x80 | (c & 0x3f));
            } // else invalid Unicode char, so ignored
        }
        return ret;
    }